

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid_tools.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  _Alloc_hider _Var2;
  int iVar3;
  ulonglong uVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  unsigned_long_long grid_id;
  uint64_t limit;
  int64_t iVar8;
  char *__endptr;
  string command;
  allocator local_89;
  char *local_88;
  string local_80;
  int local_5c;
  ulonglong local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (argc < 2) goto LAB_00103dde;
  std::__cxx11::string::string((string *)local_50,argv[1],(allocator *)&local_80);
  iVar3 = std::__cxx11::string::compare((char *)local_50);
  if (iVar3 == 0) {
    bVar1 = true;
    if (argc != 2) {
      std::__cxx11::string::string((string *)&local_80,argv[2],&local_89);
      _Var2._M_p = local_80._M_dataplus._M_p;
      piVar5 = __errno_location();
      iVar3 = *piVar5;
      *piVar5 = 0;
      uVar4 = strtoull(_Var2._M_p,&local_88,10);
      if (local_88 == _Var2._M_p) {
LAB_00103df8:
        std::__throw_invalid_argument("stoull");
        goto LAB_00103e04;
      }
      local_58 = uVar4;
      if (*piVar5 == 0) {
        *piVar5 = iVar3;
      }
      else if (*piVar5 == 0x22) goto LAB_00103c62;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      uVar4 = 1;
      if (3 < argc) {
        std::__cxx11::string::string((string *)&local_80,argv[3],&local_89);
        _Var2._M_p = local_80._M_dataplus._M_p;
        local_5c = *piVar5;
        *piVar5 = 0;
        uVar4 = strtoull(local_80._M_dataplus._M_p,&local_88,10);
        if (local_88 == _Var2._M_p) goto LAB_00103df8;
        if (*piVar5 == 0) {
          *piVar5 = local_5c;
        }
        else if (*piVar5 == 0x22) {
LAB_00103c62:
          std::__throw_out_of_range("stoull");
        }
      }
      if ((3 < argc) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2)) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      ListPatterns(local_58,uVar4);
      goto LAB_00103dab;
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    if (iVar3 == 0) {
      bVar1 = true;
      if (argc != 4) goto LAB_00103dad;
      std::__cxx11::string::string((string *)&local_80,argv[2],&local_89);
      _Var2._M_p = local_80._M_dataplus._M_p;
      piVar5 = __errno_location();
      iVar3 = *piVar5;
      *piVar5 = 0;
      lVar6 = strtol(_Var2._M_p,&local_88,10);
      if (local_88 != _Var2._M_p) {
        if (((int)lVar6 != lVar6) || (*piVar5 == 0x22)) goto LAB_00103e10;
        if (*piVar5 == 0) {
          *piVar5 = iVar3;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::string((string *)&local_80,argv[3],&local_89);
        _Var2._M_p = local_80._M_dataplus._M_p;
        iVar3 = *piVar5;
        *piVar5 = 0;
        lVar7 = strtol(local_80._M_dataplus._M_p,&local_88,10);
        if (local_88 != _Var2._M_p) {
          if ((lVar7 - 0x80000000U < 0xffffffff00000000) || (*piVar5 == 0x22)) goto LAB_00103e10;
          if (*piVar5 == 0) {
            *piVar5 = iVar3;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
          CountGrids((int)lVar6,(int)lVar7);
          goto LAB_00103dab;
        }
      }
LAB_00103e04:
      std::__throw_invalid_argument("stoi");
LAB_00103e10:
      std::__throw_out_of_range("stoi");
    }
    iVar3 = std::__cxx11::string::compare((char *)local_50);
    if (iVar3 == 0) {
      MakeTables();
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)local_50);
      if (iVar3 == 0) {
        bVar1 = true;
        if (argc == 2) goto LAB_00103dad;
        std::__cxx11::string::string((string *)&local_80,argv[2],(allocator *)&local_88);
        grid_id = std::__cxx11::stoull(&local_80,(size_t *)0x0,10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        limit = 1;
        if (3 < argc) {
          std::__cxx11::string::string((string *)&local_80,argv[3],(allocator *)&local_88);
          limit = std::__cxx11::stoull(&local_80,(size_t *)0x0,10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        ListGrids(grid_id,limit);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_50);
        if (iVar3 == 0) {
          iVar8 = -1;
          if (argc != 2) {
            std::__cxx11::string::string((string *)&local_80,argv[2],(allocator *)&local_88);
            iVar8 = std::__cxx11::stoll(&local_80,(size_t *)0x0,10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          SampleGrids(iVar8);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)local_50);
          bVar1 = true;
          if (iVar3 != 0) goto LAB_00103dad;
          iVar8 = -1;
          if (argc != 2) {
            std::__cxx11::string::string((string *)&local_80,argv[2],(allocator *)&local_88);
            iVar8 = std::__cxx11::stoll(&local_80,(size_t *)0x0,10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
          }
          SamplePuzzles(iVar8);
        }
      }
    }
LAB_00103dab:
    bVar1 = false;
  }
LAB_00103dad:
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (!bVar1) {
    return 0;
  }
LAB_00103dde:
  std::operator<<((ostream *)&std::cout,
                  "\nThis program provides tools for counting the set of essentially different\nSudoku grids and sampling from this set with uniform probability.\n\nIt also supports sampling from the set of essentially different minimal\nSudoku puzzles with uniform conditional probability given clue count. The\nsampler is biased towards producing puzzles with fewer clues, but this\nbias is quantified and puzzles are produced along with weights that can\nbe used to adjust statistics if desired.\n\nTo achieve these goals we first enumerate all the essentially different\nconfigurations of the first band and stack of the board (leaving the 6x6\ncells at the bottom right unconstrained). For each of these configurations\nwe then use the solver to count the number of possible grid completions.\nFinally we use these counts to construct a table and index that allow mapping\nany of the 27704267971*2^7 grid classes to a configuration and solution offset.\n\nTo construct these tables use the command below. If you have downloaded\npre-generated tables you can skip this step and the next.\n\n  chunksize=$((36228 * 36228 / 64))\n  for i in {0..63}; do\n    build/grid_tools count_grids $(( i * chunksize )) $(( (i + 1) * chunksize )) > chunk.$i &\n  done\n  wait\n\nAdjust the parallelism used above as appropriate for your platform. On a\nThreadripper 2990WX with 64 processes this takes about 8 hours.\n\nNow make the tables, taking care to consume the chunks of counts in order:\n\n  build/grid_tools make_tables < <(cat chunk.{0..63})\n\nWith the generated tables and index in the current directory you can now get\nany numbered grid in range(27704267971*2^7), or you can sample grids randomly:\n\n  build/grid_tools list_grids <first_gird_id> [<limit>=1]\n  build/grid_tools sample_grids [<limit>=-1]\n\nYou can also sample minimal puzzles via a very slow rejection sampling procedure\nlike so:\n\n  build/grid_gools sample_puzzles [<limit>=-1]\n\n"
                 );
  exit(0);
}

Assistant:

int main(int argc, char **argv) {
    if (argc > 1) {
        string command(argv[1]);
        if (command == "pattern") {
            if (argc > 2) {
                uint64_t start = stoull(argv[2]);
                uint64_t limit = argc > 3 ? stoull(argv[3]) : 1u;
                ListPatterns(start, limit);
                return 0;
            }
        } else if (command == "count_grids") {
            if (argc == 4) {
                int start = stoi(argv[2]);
                int limit = stoi(argv[3]);
                CountGrids(start, limit);
                return 0;
            }
        } else if (command == "make_tables") {
            MakeTables();
            return 0;
        } else if (command == "list_grids") {
            if (argc > 2) {
                uint64_t start = stoull(argv[2]);
                uint64_t limit = argc > 3 ? stoull(argv[3]) : 1u;
                ListGrids(start, limit);
                return 0;
            }
        } else if (command == "sample_grids") {
            int64_t limit = argc > 2 ? stoll(argv[2]) : -1;
            SampleGrids(limit);
            return 0;
        } else if (command == "sample_puzzles") {
            int64_t limit = argc > 2 ? stoll(argv[2]) : -1;
            SamplePuzzles(limit);
            return 0;
        }
    }
    usage();
}